

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiskin.cpp
# Opt level: O3

void findOutSeparators(IntVector *target,IntVector *source,uint n)

{
  pointer piVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  pointer piVar6;
  pointer piVar7;
  int iVar8;
  ulong uVar5;
  ulong uVar9;
  
  piVar7 = (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar6 = (source->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar5 = (ulong)((int)((ulong)((long)piVar6 - (long)piVar7) >> 2) - 1);
  uVar2 = uVar5 / (n - 1);
  uVar5 = uVar5 % (ulong)(n - 1);
  uVar3 = 0;
  piVar1 = (target->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((int)uVar5 != 0) {
    uVar3 = 0;
    do {
      piVar1[uVar3] = *piVar7;
      uVar9 = uVar2;
      do {
        piVar7 = piVar7 + 1;
        iVar8 = (int)uVar9;
        uVar9 = (ulong)(iVar8 - 1);
      } while (iVar8 != 0);
      uVar3 = uVar3 + 1;
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 != 0);
  }
  piVar6 = piVar6 + -1;
  while (piVar7 != piVar6) {
    piVar1[uVar3 & 0xffffffff] = *piVar7;
    uVar5 = uVar2;
    do {
      piVar7 = piVar7 + 1;
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 != 0);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  piVar1[uVar3 & 0xffffffff] = *piVar6;
  return;
}

Assistant:

void findOutSeparators (IntVector &target, IntVector &source, uint n) {
	auto it		= source.begin ();
	uint size1	= source.size ()-1;		// Number of elements to be taken into account (belonging to vector)
	uint n1		= n-1;					// Number of elements to be selected
	uint h		= size1/n1;				// Size of subset
    uint k		= size1%n1;				// Number of subset with size h+1
	uint i		= 0;					// Index of target array
	uint tmpN1	= 0;
	
	while (k--) {
		target[i++]	= *(it++);
		tmpN1		= h;
		while (tmpN1--)
			it++;
    }
    while (it != source.end()-1) {
		target[i++]	= *(it++);
		tmpN1	= h-1;
		while (tmpN1--)
			it++;
	}

	target[i]	= *(source.end()-1);
}